

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::ResourceNameBufferLimitCase::iterate
          (ResourceNameBufferLimitCase *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ProgramSources *sources;
  TestLog *pTVar7;
  TestError *pTVar8;
  MessageBuilder *pMVar9;
  int *local_d68;
  int local_cf8;
  int local_c54;
  MessageBuilder local_c50;
  int local_ad0;
  int local_acc;
  MessageBuilder local_ac8;
  int local_944;
  MessageBuilder local_940;
  MessageBuilder local_7c0;
  MessageBuilder local_640;
  MessageBuilder local_4c0;
  int local_33c;
  char local_338 [4];
  GLsizei written;
  char buffer [26];
  int local_314 [2];
  int expectedWriteLen;
  int uniformNameLen;
  allocator<char> local_2e1;
  string local_2e0;
  ScopedLogSection local_2c0;
  ScopedLogSection section_1;
  int ndx;
  undefined1 local_28a;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  ScopedLogSection local_218;
  ScopedLogSection section;
  GLuint uniformIndex;
  string local_200;
  ShaderSource local_1e0;
  ProgramSources local_1b8;
  undefined1 local_e8 [8];
  ShaderProgram program;
  Functions *gl;
  ResourceNameBufferLimitCase *this_local;
  char *pcVar6;
  
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  pcVar6 = (char *)CONCAT44(extraout_var,iVar3);
  program.m_program.m_info.linkTimeUs = (deUint64)pcVar6;
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_1b8);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_200,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)
             "${GLSL_VERSION_DECL}\nlayout(local_size_x = 1) in;\nuniform highp int u_uniformWithALongName;\nwriteonly buffer OutputBufferBlock { highp int b_output_int; };\nvoid main ()\n{\n\tb_output_int = u_uniformWithALongName;\n}\n"
             ,pcVar6);
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_1e0,&local_200);
  sources = glu::ProgramSources::operator<<(&local_1b8,&local_1e0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e8,pRVar5,sources);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  glu::ProgramSources::~ProgramSources(&local_1b8);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"Program",&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"Program",&local_261);
  tcu::ScopedLogSection::ScopedLogSection(&local_218,pTVar7,&local_238,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(pTVar7,(ShaderProgram *)local_e8);
  bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_e8);
  if (!bVar2) {
    local_28a = 1;
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,"could not build program",&local_289);
    tcu::TestError::TestError(pTVar8,&local_288);
    local_28a = 0;
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_218);
  pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x9a8);
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
  section.m_log._0_4_ = (*pcVar1)(dVar4,0x92e1,"u_uniformWithALongName");
  dVar4 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
  glu::checkError(dVar4,"query resource index",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                  ,0x5c6);
  if ((int)section.m_log != -1) {
    for (section_1.m_log._0_4_ = 0; (int)section_1.m_log < 8;
        section_1.m_log._0_4_ = (int)section_1.m_log + 1) {
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"Query",&local_2e1);
      pcVar6 = iterate::querySizes[(int)section_1.m_log].description;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&uniformNameLen,pcVar6,(allocator<char> *)((long)&expectedWriteLen + 3));
      tcu::ScopedLogSection::ScopedLogSection
                (&local_2c0,pTVar7,&local_2e0,(string *)&uniformNameLen);
      std::__cxx11::string::~string((string *)&uniformNameLen);
      std::allocator<char>::~allocator((allocator<char> *)((long)&expectedWriteLen + 3));
      std::__cxx11::string::~string((string *)&local_2e0);
      std::allocator<char>::~allocator(&local_2e1);
      local_314[1] = 0x16;
      if (iterate::querySizes[(int)section_1.m_log].querySize == 0) {
        local_cf8 = 0;
      }
      else {
        local_cf8 = de::min<int>(0x16,iterate::querySizes[(int)section_1.m_log].querySize + -1);
      }
      local_314[0] = local_cf8;
      local_33c = -1;
      ::deMemset(local_338,0x78,0x1a);
      if (iterate::querySizes[(int)section_1.m_log].querySize == 0) {
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_640,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (&local_640,(char (*) [43])"Querying uniform name to a buffer of size ");
        pMVar9 = tcu::MessageBuilder::operator<<
                           (pMVar9,&iterate::querySizes[(int)section_1.m_log].querySize);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (pMVar9,(char (*) [35])", expecting query to write 0 bytes");
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_640);
      }
      else {
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_4c0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (&local_4c0,(char (*) [43])"Querying uniform name to a buffer of size ");
        pMVar9 = tcu::MessageBuilder::operator<<
                           (pMVar9,&iterate::querySizes[(int)section_1.m_log].querySize);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (pMVar9,(char (*) [28])", expecting query to write ");
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,local_314);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (pMVar9,(char (*) [37])" bytes followed by a null terminator");
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_4c0);
      }
      pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x9c0);
      dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e8);
      if ((iterate::querySizes[(int)section_1.m_log].returnLength & 1U) == 0) {
        local_d68 = (int *)0x0;
      }
      else {
        local_d68 = &local_33c;
      }
      (*pcVar1)(dVar4,0x92e1,(int)section.m_log,iterate::querySizes[(int)section_1.m_log].querySize,
                local_d68,local_338);
      dVar4 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
      glu::checkError(dVar4,"query resource name",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                      ,0x5fa);
      if (((iterate::querySizes[(int)section_1.m_log].returnLength & 1U) == 0) ||
         (local_33c == local_314[0])) {
        if ((iterate::querySizes[(int)section_1.m_log].querySize == 0) ||
           (local_338[local_314[0]] == '\0')) {
          if ((iterate::querySizes[(int)section_1.m_log].querySize == 0) ||
             (local_338[local_314[0] + 1] == 'x')) {
            if ((iterate::querySizes[(int)section_1.m_log].querySize == 0) && (local_338[0] != 'x'))
            {
              pTVar7 = tcu::TestContext::getLog
                                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        (&local_c50,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar9 = tcu::MessageBuilder::operator<<
                                 (&local_c50,
                                  (char (*) [80])
                                  "Error, buffer size was 0 but buffer contents were modified. At index 0 got dec="
                                 );
              local_c54 = (int)local_338[0];
              pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_c54);
              tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_c50);
              tcu::TestContext::setTestResult
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                         QP_TEST_RESULT_FAIL,"Buffer contents were modified");
            }
          }
          else {
            pTVar7 = tcu::TestContext::getLog
                               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_ac8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar9 = tcu::MessageBuilder::operator<<
                               (&local_ac8,(char (*) [23])"Error, guard at index ");
            local_acc = local_314[0] + 1;
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_acc);
            pMVar9 = tcu::MessageBuilder::operator<<
                               (pMVar9,(char (*) [24])" was modified, got dec=");
            local_ad0 = (int)local_338[local_314[0] + 1];
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_ad0);
            tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_ac8);
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Wrote over buffer size");
          }
        }
        else {
          pTVar7 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_940,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (&local_940,(char (*) [36])"Error, expected null terminator at ");
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,local_314);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [11])0x2c14e21);
          local_944 = (int)local_338[local_314[0]];
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_944);
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_940);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Missing null terminator");
        }
      }
      else {
        pTVar7 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_7c0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (&local_7c0,(char (*) [33])"Error, expected write length of ");
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,local_314);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [7])0x2c59494);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_33c);
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_7c0);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Unexpected write lenght");
      }
      tcu::ScopedLogSection::~ScopedLogSection(&local_2c0);
    }
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e8);
    return STOP;
  }
  section_1.m_log._6_1_ = 1;
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx,"Uniform u_uniformWithALongName resource index was GL_INVALID_INDEX",
             (allocator<char> *)((long)&section_1.m_log + 7));
  tcu::TestError::TestError(pTVar8,(string *)&ndx);
  section_1.m_log._6_1_ = 0;
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

ResourceNameBufferLimitCase::IterateResult ResourceNameBufferLimitCase::iterate (void)
{
	static const char* const computeSource =	"${GLSL_VERSION_DECL}\n"
												"layout(local_size_x = 1) in;\n"
												"uniform highp int u_uniformWithALongName;\n"
												"writeonly buffer OutputBufferBlock { highp int b_output_int; };\n"
												"void main ()\n"
												"{\n"
												"	b_output_int = u_uniformWithALongName;\n"
												"}\n";

	const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
	const glu::ShaderProgram	program			(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(specializeShader(m_context, computeSource)));
	glw::GLuint					uniformIndex;

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Log program
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Program", "Program");

		m_testCtx.getLog() << program;
		if (!program.isOk())
			throw tcu::TestError("could not build program");
	}

	uniformIndex = gl.getProgramResourceIndex(program.getProgram(), GL_UNIFORM, "u_uniformWithALongName");
	GLU_EXPECT_NO_ERROR(gl.getError(), "query resource index");

	if (uniformIndex == GL_INVALID_INDEX)
		throw tcu::TestError("Uniform u_uniformWithALongName resource index was GL_INVALID_INDEX");

	// Query with different sized buffers, len("u_uniformWithALongName") == 22

	{
		static const struct
		{
			const char*	description;
			int			querySize;
			bool		returnLength;
		} querySizes[] =
		{
			{ "Query to larger buffer",										24,		true	},
			{ "Query to buffer the same size",								23,		true	},
			{ "Query to one byte too small buffer",							22,		true	},
			{ "Query to one byte buffer",									1,		true	},
			{ "Query to zero sized buffer",									0,		true	},
			{ "Query to one byte too small buffer, null length argument",	22,		false	},
			{ "Query to one byte buffer, null length argument",				1,		false	},
			{ "Query to zero sized buffer, null length argument",			0,		false	},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(querySizes); ++ndx)
		{
			const tcu::ScopedLogSection			section				(m_testCtx.getLog(), "Query", querySizes[ndx].description);
			const int							uniformNameLen		= 22;
			const int							expectedWriteLen	= (querySizes[ndx].querySize != 0) ? (de::min(uniformNameLen, (querySizes[ndx].querySize - 1))) : (0);
			char								buffer				[26];
			glw::GLsizei						written				= -1;

			// One byte for guard
			DE_ASSERT((int)sizeof(buffer) > querySizes[ndx].querySize);

			deMemset(buffer, 'x', sizeof(buffer));

			if (querySizes[ndx].querySize)
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Querying uniform name to a buffer of size " << querySizes[ndx].querySize
					<< ", expecting query to write " << expectedWriteLen << " bytes followed by a null terminator"
					<< tcu::TestLog::EndMessage;
			else
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Querying uniform name to a buffer of size " << querySizes[ndx].querySize
					<< ", expecting query to write 0 bytes"
					<< tcu::TestLog::EndMessage;

			gl.getProgramResourceName(program.getProgram(), GL_UNIFORM, uniformIndex, querySizes[ndx].querySize, (querySizes[ndx].returnLength) ? (&written) : (DE_NULL), buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query resource name");

			if (querySizes[ndx].returnLength && written != expectedWriteLen)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected write length of " << expectedWriteLen << ", got " << written << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected write lenght");
			}
			else if (querySizes[ndx].querySize != 0 && buffer[expectedWriteLen] != 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, expected null terminator at " << expectedWriteLen << ", got dec=" << (int)buffer[expectedWriteLen] << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Missing null terminator");
			}
			else if (querySizes[ndx].querySize != 0 && buffer[expectedWriteLen+1] != 'x')
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, guard at index " << (expectedWriteLen+1) << " was modified, got dec=" << (int)buffer[expectedWriteLen+1] << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Wrote over buffer size");
			}
			else if (querySizes[ndx].querySize == 0 && buffer[0] != 'x')
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, buffer size was 0 but buffer contents were modified. At index 0 got dec=" << (int)buffer[0] << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Buffer contents were modified");
			}
		}
	}

	return STOP;
}